

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForScalarVectorFieldHelper
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,int indents)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong *puVar7;
  char *pcVar8;
  uint uVar9;
  string type_name;
  string field_field;
  string struct_type;
  string field_method;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(local_b0,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(local_70,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_90,pIVar1,struct_def);
  BVar3 = (field->value).type.element;
  GenIndents_abi_cxx11_(&local_50,this,indents);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
  local_f0 = &local_e0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_d0 = &local_c0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar4[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70[0]);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_110.field_2._M_allocated_capacity = *psVar6;
    local_110.field_2._8_8_ = plVar4[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar6;
    local_110._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_110._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_130 = &local_120;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_120 = *plVar5;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0[0]);
  paVar2 = &local_150.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150.field_2._8_8_ = plVar4[3];
    local_150._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_150._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_160 = *puVar7;
    lStack_158 = plVar4[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar7;
    local_170 = (ulong *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_110,this,indents);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_130 = &local_120;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_120 = *plVar5;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0[0]);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150.field_2._8_8_ = plVar4[3];
    local_150._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_150._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_160 = *puVar7;
    lStack_158 = plVar4[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar7;
    local_170 = (ulong *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_150,this,indents + 1);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_160 = *puVar7;
    lStack_158 = plVar4[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar7;
    local_170 = (ulong *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_168 = 0;
  local_160 = local_160 & 0xffffffffffffff00;
  uVar9 = BVar3 - BASE_TYPE_BOOL;
  if (uVar9 < 0xc) {
    pcVar8 = &DAT_003798b8 + *(int *)(&DAT_003798b8 + (ulong)uVar9 * 4);
  }
  else {
    pcVar8 = "VOffsetT";
  }
  local_170 = &local_160;
  std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)0x0,(ulong)pcVar8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void GenPackForScalarVectorFieldHelper(const StructDef &struct_def,
                                         const FieldDef &field,
                                         std::string *code_ptr,
                                         int indents) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);
    const auto vectortype = field.value.type.VectorType();

    code += GenIndents(indents) + struct_type + "Start" + field_method +
            "Vector(builder, len(self." + field_field + "))";
    code += GenIndents(indents) + "for i in reversed(range(len(self." +
            field_field + "))):";
    code += GenIndents(indents + 1) + "builder.Prepend";

    std::string type_name;
    switch (vectortype.base_type) {
      case BASE_TYPE_BOOL: type_name = "Bool"; break;
      case BASE_TYPE_CHAR: type_name = "Byte"; break;
      case BASE_TYPE_UCHAR: type_name = "Uint8"; break;
      case BASE_TYPE_SHORT: type_name = "Int16"; break;
      case BASE_TYPE_USHORT: type_name = "Uint16"; break;
      case BASE_TYPE_INT: type_name = "Int32"; break;
      case BASE_TYPE_UINT: type_name = "Uint32"; break;
      case BASE_TYPE_LONG: type_name = "Int64"; break;
      case BASE_TYPE_ULONG: type_name = "Uint64"; break;
      case BASE_TYPE_FLOAT: type_name = "Float32"; break;
      case BASE_TYPE_DOUBLE: type_name = "Float64"; break;
      case BASE_TYPE_STRING: type_name = "UOffsetTRelative"; break;
      default: type_name = "VOffsetT"; break;
    }
    code += type_name;
  }